

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O0

void AArch64_printInst(MCInst *MI,SStream *O,void *Info)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  _Bool _Var3;
  uint uVar4;
  int iVar5;
  arm64_reg aVar6;
  int iVar7;
  MCOperand *pMVar8;
  MCOperand *pMVar9;
  MCOperand *pMVar10;
  MCOperand *op;
  int64_t iVar11;
  int64_t iVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  int iVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  int BitWidth;
  int ImmS;
  int ImmR;
  MCOperand *Op2_1;
  MCOperand *Op0_1;
  int imms;
  int immr;
  int shift;
  char *AsmMnemonic_1;
  char *AsmMnemonic;
  _Bool Is64Bit;
  _Bool IsSigned;
  MCOperand *Op3;
  MCOperand *Op2;
  MCOperand *Op1;
  MCOperand *Op0;
  char *mnem;
  int Width;
  int LSB;
  uint Opcode;
  void *Info_local;
  SStream *O_local;
  MCInst *MI_local;
  
  uVar4 = MCInst_getOpcode(MI);
  if ((uVar4 != 0x7c2) || (_Var3 = printSysAlias(MI,O), !_Var3)) {
    if ((uVar4 == 0x501) || (((uVar4 == 0x500 || (uVar4 == 0x81f)) || (uVar4 == 0x81e)))) {
      pMVar8 = MCInst_getOperand(MI,0);
      pMVar9 = MCInst_getOperand(MI,1);
      pMVar10 = MCInst_getOperand(MI,2);
      op = MCInst_getOperand(MI,3);
      bVar17 = uVar4 == 0x501;
      bVar18 = uVar4 == 0x500;
      bVar19 = uVar4 == 0x501;
      bVar20 = uVar4 == 0x81f;
      _Var3 = MCOperand_isImm(pMVar10);
      if (((_Var3) && (iVar11 = MCOperand_getImm(pMVar10), iVar11 == 0)) &&
         (_Var3 = MCOperand_isImm(op), _Var3)) {
        AsmMnemonic_1 = (char *)0x0;
        iVar11 = MCOperand_getImm(op);
        if (iVar11 == 7) {
          if (bVar17 || bVar18) {
            AsmMnemonic_1 = "sxtb";
          }
          else if (!bVar19 && !bVar20) {
            AsmMnemonic_1 = "uxtb";
          }
        }
        else if (iVar11 == 0xf) {
          if (bVar17 || bVar18) {
            AsmMnemonic_1 = "sxth";
          }
          else if (!bVar19 && !bVar20) {
            AsmMnemonic_1 = "uxth";
          }
        }
        else if (((iVar11 == 0x1f) && (bVar19 || bVar20)) && (bVar17 || bVar18)) {
          AsmMnemonic_1 = "sxtw";
        }
        if (AsmMnemonic_1 != (char *)0x0) {
          uVar4 = MCOperand_getReg(pMVar8);
          pcVar13 = getRegisterName(uVar4,0);
          uVar4 = MCOperand_getReg(pMVar9);
          uVar4 = getWRegFromXReg(uVar4);
          pcVar14 = getRegisterName(uVar4,0);
          SStream_concat(O,"%s\t%s, %s",AsmMnemonic_1,pcVar13,pcVar14);
          if (MI->csh->detail != CS_OPT_OFF) {
            puVar1 = MI->flat_insn->detail->groups +
                     (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x2e;
            puVar1[0] = '\x01';
            puVar1[1] = '\0';
            puVar1[2] = '\0';
            puVar1[3] = '\0';
            uVar4 = MCOperand_getReg(pMVar8);
            *(uint *)(MI->flat_insn->detail->groups +
                     (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x36) = uVar4;
            pcVar2 = MI->flat_insn->detail;
            (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
            puVar1 = MI->flat_insn->detail->groups +
                     (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x2e;
            puVar1[0] = '\x01';
            puVar1[1] = '\0';
            puVar1[2] = '\0';
            puVar1[3] = '\0';
            uVar4 = MCOperand_getReg(pMVar9);
            uVar4 = getWRegFromXReg(uVar4);
            *(uint *)(MI->flat_insn->detail->groups +
                     (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x36) = uVar4;
            pcVar2 = MI->flat_insn->detail;
            (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
          }
          aVar6 = AArch64_map_insn(AsmMnemonic_1);
          MCInst_setOpcodePub(MI,aVar6);
          return;
        }
      }
      _Var3 = MCOperand_isImm(pMVar10);
      if ((_Var3) && (_Var3 = MCOperand_isImm(op), _Var3)) {
        _immr = (char *)0x0;
        imms = 0;
        iVar11 = MCOperand_getImm(pMVar10);
        iVar5 = (int)iVar11;
        iVar11 = MCOperand_getImm(op);
        iVar7 = (int)iVar11;
        if ((uVar4 == 0x81e) && ((iVar7 != 0x1f && (iVar7 + 1 == iVar5)))) {
          _immr = "lsl";
          imms = 0x1f - iVar7;
        }
        else if ((uVar4 == 0x81f) && ((iVar7 != 0x3f && (iVar7 + 1 == iVar5)))) {
          _immr = "lsl";
          imms = 0x3f - iVar7;
        }
        else if ((uVar4 == 0x81e) && (iVar7 == 0x1f)) {
          _immr = "lsr";
          imms = iVar5;
        }
        else if ((uVar4 == 0x81f) && (iVar7 == 0x3f)) {
          _immr = "lsr";
          imms = iVar5;
        }
        else if ((uVar4 == 0x500) && (iVar7 == 0x1f)) {
          _immr = "asr";
          imms = iVar5;
        }
        else if ((uVar4 == 0x501) && (iVar7 == 0x3f)) {
          _immr = "asr";
          imms = iVar5;
        }
        if (_immr != (char *)0x0) {
          uVar4 = MCOperand_getReg(pMVar8);
          pcVar13 = getRegisterName(uVar4,0);
          uVar4 = MCOperand_getReg(pMVar9);
          pcVar14 = getRegisterName(uVar4,0);
          SStream_concat(O,"%s\t%s, %s, ",_immr,pcVar13,pcVar14);
          printInt32Bang(O,imms);
          aVar6 = AArch64_map_insn(_immr);
          MCInst_setOpcodePub(MI,aVar6);
          if (MI->csh->detail == CS_OPT_OFF) {
            return;
          }
          puVar1 = MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x2e;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          uVar4 = MCOperand_getReg(pMVar8);
          *(uint *)(MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x36) = uVar4;
          pcVar2 = MI->flat_insn->detail;
          (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
          puVar1 = MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x2e;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          uVar4 = MCOperand_getReg(pMVar9);
          *(uint *)(MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x36) = uVar4;
          pcVar2 = MI->flat_insn->detail;
          (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
          puVar1 = MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x2e;
          puVar1[0] = '\x02';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          *(long *)(MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x36) = (long)imms
          ;
          pcVar2 = MI->flat_insn->detail;
          (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
          return;
        }
      }
      iVar11 = MCOperand_getImm(pMVar10);
      iVar12 = MCOperand_getImm(op);
      if (iVar12 < iVar11) {
        pcVar13 = "ubfiz";
        if (bVar17 || bVar18) {
          pcVar13 = "sbfiz";
        }
        uVar4 = MCOperand_getReg(pMVar8);
        pcVar14 = getRegisterName(uVar4,0);
        uVar4 = MCOperand_getReg(pMVar9);
        pcVar15 = getRegisterName(uVar4,0);
        SStream_concat(O,"%s\t%s, %s, ",pcVar13,pcVar14,pcVar15);
        iVar5 = 0x20;
        if (bVar19 || bVar20) {
          iVar5 = 0x40;
        }
        iVar11 = MCOperand_getImm(pMVar10);
        printInt32Bang(O,iVar5 - (int)iVar11);
        SStream_concat0(O,", ");
        iVar11 = MCOperand_getImm(op);
        printInt32Bang(O,(int)iVar11 + 1);
        pcVar13 = "ubfiz";
        if (bVar17 || bVar18) {
          pcVar13 = "sbfiz";
        }
        aVar6 = AArch64_map_insn(pcVar13);
        MCInst_setOpcodePub(MI,aVar6);
        if (MI->csh->detail != CS_OPT_OFF) {
          puVar1 = MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x2e;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          uVar4 = MCOperand_getReg(pMVar8);
          *(uint *)(MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x36) = uVar4;
          pcVar2 = MI->flat_insn->detail;
          (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
          puVar1 = MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x2e;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          uVar4 = MCOperand_getReg(pMVar9);
          *(uint *)(MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x36) = uVar4;
          pcVar2 = MI->flat_insn->detail;
          (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
          puVar1 = MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x2e;
          puVar1[0] = '\x02';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          iVar5 = 0x20;
          if (bVar19 || bVar20) {
            iVar5 = 0x40;
          }
          iVar11 = MCOperand_getImm(pMVar10);
          *(long *)(MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x36) =
               (long)(iVar5 - (int)iVar11);
          pcVar2 = MI->flat_insn->detail;
          (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
          puVar1 = MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x2e;
          puVar1[0] = '\x02';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          iVar11 = MCOperand_getImm(op);
          *(long *)(MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x36) =
               (long)((int)iVar11 + 1);
          pcVar2 = MI->flat_insn->detail;
          (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
        }
      }
      else {
        pcVar13 = "ubfx";
        if (bVar17 || bVar18) {
          pcVar13 = "sbfx";
        }
        uVar4 = MCOperand_getReg(pMVar8);
        pcVar14 = getRegisterName(uVar4,0);
        uVar4 = MCOperand_getReg(pMVar9);
        pcVar15 = getRegisterName(uVar4,0);
        SStream_concat(O,"%s\t%s, %s, ",pcVar13,pcVar14,pcVar15);
        iVar11 = MCOperand_getImm(pMVar10);
        printInt32Bang(O,(int32_t)iVar11);
        SStream_concat0(O,", ");
        iVar11 = MCOperand_getImm(op);
        iVar12 = MCOperand_getImm(pMVar10);
        printInt32Bang(O,((int)iVar11 - (int)iVar12) + 1);
        pcVar13 = "ubfx";
        if (bVar17 || bVar18) {
          pcVar13 = "sbfx";
        }
        aVar6 = AArch64_map_insn(pcVar13);
        MCInst_setOpcodePub(MI,aVar6);
        if (MI->csh->detail != CS_OPT_OFF) {
          puVar1 = MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x2e;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          uVar4 = MCOperand_getReg(pMVar8);
          *(uint *)(MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x36) = uVar4;
          pcVar2 = MI->flat_insn->detail;
          (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
          puVar1 = MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x2e;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          uVar4 = MCOperand_getReg(pMVar9);
          *(uint *)(MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x36) = uVar4;
          pcVar2 = MI->flat_insn->detail;
          (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
          puVar1 = MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x2e;
          puVar1[0] = '\x02';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          iVar11 = MCOperand_getImm(pMVar10);
          *(long *)(MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x36) =
               (long)(int)iVar11;
          pcVar2 = MI->flat_insn->detail;
          (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
          puVar1 = MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x2e;
          puVar1[0] = '\x02';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          iVar11 = MCOperand_getImm(op);
          iVar12 = MCOperand_getImm(pMVar10);
          *(long *)(MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x36) =
               (long)(((int)iVar11 - (int)iVar12) + 1);
          pcVar2 = MI->flat_insn->detail;
          (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
        }
      }
    }
    else if ((uVar4 == 0x67) || (uVar4 == 0x66)) {
      pMVar8 = MCInst_getOperand(MI,0);
      pMVar9 = MCInst_getOperand(MI,2);
      pMVar10 = MCInst_getOperand(MI,3);
      iVar11 = MCOperand_getImm(pMVar10);
      iVar5 = (int)iVar11;
      pMVar10 = MCInst_getOperand(MI,4);
      iVar11 = MCOperand_getImm(pMVar10);
      iVar7 = (int)iVar11;
      if (iVar7 < iVar5) {
        iVar16 = 0x20;
        if (uVar4 == 0x67) {
          iVar16 = 0x40;
        }
        iVar16 = (iVar16 - iVar5) % iVar16;
        uVar4 = MCOperand_getReg(pMVar8);
        pcVar13 = getRegisterName(uVar4,0);
        uVar4 = MCOperand_getReg(pMVar9);
        pcVar14 = getRegisterName(uVar4,0);
        SStream_concat(O,"bfi\t%s, %s, ",pcVar13,pcVar14);
        printInt32Bang(O,iVar16);
        SStream_concat0(O,", ");
        printInt32Bang(O,iVar7 + 1);
        aVar6 = AArch64_map_insn("bfi");
        MCInst_setOpcodePub(MI,aVar6);
        if (MI->csh->detail != CS_OPT_OFF) {
          puVar1 = MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x2e;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          uVar4 = MCOperand_getReg(pMVar8);
          *(uint *)(MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x36) = uVar4;
          pcVar2 = MI->flat_insn->detail;
          (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
          puVar1 = MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x2e;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          uVar4 = MCOperand_getReg(pMVar9);
          *(uint *)(MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x36) = uVar4;
          pcVar2 = MI->flat_insn->detail;
          (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
          puVar1 = MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x2e;
          puVar1[0] = '\x02';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          *(long *)(MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x36) =
               (long)iVar16;
          pcVar2 = MI->flat_insn->detail;
          (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
          puVar1 = MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x2e;
          puVar1[0] = '\x02';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          *(long *)(MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x36) =
               (long)(iVar7 + 1);
          pcVar2 = MI->flat_insn->detail;
          (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
        }
      }
      else {
        iVar7 = (iVar7 - iVar5) + 1;
        uVar4 = MCOperand_getReg(pMVar8);
        pcVar13 = getRegisterName(uVar4,0);
        uVar4 = MCOperand_getReg(pMVar9);
        pcVar14 = getRegisterName(uVar4,0);
        SStream_concat(O,"bfxil\t%s, %s, ",pcVar13,pcVar14);
        printInt32Bang(O,iVar5);
        SStream_concat0(O,", ");
        printInt32Bang(O,iVar7);
        aVar6 = AArch64_map_insn("bfxil");
        MCInst_setOpcodePub(MI,aVar6);
        if (MI->csh->detail != CS_OPT_OFF) {
          puVar1 = MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x2e;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          uVar4 = MCOperand_getReg(pMVar8);
          *(uint *)(MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x36) = uVar4;
          pcVar2 = MI->flat_insn->detail;
          (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
          puVar1 = MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x2e;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          uVar4 = MCOperand_getReg(pMVar9);
          *(uint *)(MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x36) = uVar4;
          pcVar2 = MI->flat_insn->detail;
          (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
          puVar1 = MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x2e;
          puVar1[0] = '\x02';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          *(long *)(MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x36) =
               (long)iVar5;
          pcVar2 = MI->flat_insn->detail;
          (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
          puVar1 = MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x2e;
          puVar1[0] = '\x02';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          *(long *)(MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x36) =
               (long)iVar7;
          pcVar2 = MI->flat_insn->detail;
          (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
        }
      }
    }
    else {
      pcVar13 = printAliasInstr(MI,O,Info);
      if (pcVar13 == (char *)0x0) {
        printInstruction(MI,O,(MCRegisterInfo *)Info);
      }
      else {
        aVar6 = AArch64_map_insn(pcVar13);
        MCInst_setOpcodePub(MI,aVar6);
        (*cs_mem_free)(pcVar13);
      }
    }
  }
  return;
}

Assistant:

void AArch64_printInst(MCInst *MI, SStream *O, void *Info)
{
	// Check for special encodings and print the canonical alias instead.
	unsigned Opcode = MCInst_getOpcode(MI);
	int LSB;
	int Width;
	char *mnem;

	if (Opcode == AArch64_SYSxt && printSysAlias(MI, O))
		return;

	// SBFM/UBFM should print to a nicer aliased form if possible.
	if (Opcode == AArch64_SBFMXri || Opcode == AArch64_SBFMWri ||
			Opcode == AArch64_UBFMXri || Opcode == AArch64_UBFMWri) {
		MCOperand *Op0 = MCInst_getOperand(MI, 0);
		MCOperand *Op1 = MCInst_getOperand(MI, 1);
		MCOperand *Op2 = MCInst_getOperand(MI, 2);
		MCOperand *Op3 = MCInst_getOperand(MI, 3);

		bool IsSigned = (Opcode == AArch64_SBFMXri || Opcode == AArch64_SBFMWri);
		bool Is64Bit = (Opcode == AArch64_SBFMXri || Opcode == AArch64_UBFMXri);

		if (MCOperand_isImm(Op2) && MCOperand_getImm(Op2) == 0 && MCOperand_isImm(Op3)) {
			char *AsmMnemonic = NULL;

			switch (MCOperand_getImm(Op3)) {
				default:
					break;
				case 7:
					if (IsSigned)
						AsmMnemonic = "sxtb";
					else if (!Is64Bit)
						AsmMnemonic = "uxtb";
					break;
				case 15:
					if (IsSigned)
						AsmMnemonic = "sxth";
					else if (!Is64Bit)
						AsmMnemonic = "uxth";
					break;
				case 31:
					// *xtw is only valid for signed 64-bit operations.
					if (Is64Bit && IsSigned)
						AsmMnemonic = "sxtw";
					break;
			}

			if (AsmMnemonic) {
				SStream_concat(O, "%s\t%s, %s", AsmMnemonic,
						getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
						getRegisterName(getWRegFromXReg(MCOperand_getReg(Op1)), AArch64_NoRegAltName));

				if (MI->csh->detail) {
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
					MI->flat_insn->detail->arm64.op_count++;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = getWRegFromXReg(MCOperand_getReg(Op1));
					MI->flat_insn->detail->arm64.op_count++;
				}

				MCInst_setOpcodePub(MI, AArch64_map_insn(AsmMnemonic));

				return;
			}
		}

		// All immediate shifts are aliases, implemented using the Bitfield
		// instruction. In all cases the immediate shift amount shift must be in
		// the range 0 to (reg.size -1).
		if (MCOperand_isImm(Op2) && MCOperand_isImm(Op3)) {
			char *AsmMnemonic = NULL;
			int shift = 0;
			int immr = (int)MCOperand_getImm(Op2);
			int imms = (int)MCOperand_getImm(Op3);

			if (Opcode == AArch64_UBFMWri && imms != 0x1F && ((imms + 1) == immr)) {
				AsmMnemonic = "lsl";
				shift = 31 - imms;
			} else if (Opcode == AArch64_UBFMXri && imms != 0x3f &&
					((imms + 1 == immr))) {
				AsmMnemonic = "lsl";
				shift = 63 - imms;
			} else if (Opcode == AArch64_UBFMWri && imms == 0x1f) {
				AsmMnemonic = "lsr";
				shift = immr;
			} else if (Opcode == AArch64_UBFMXri && imms == 0x3f) {
				AsmMnemonic = "lsr";
				shift = immr;
			} else if (Opcode == AArch64_SBFMWri && imms == 0x1f) {
				AsmMnemonic = "asr";
				shift = immr;
			} else if (Opcode == AArch64_SBFMXri && imms == 0x3f) {
				AsmMnemonic = "asr";
				shift = immr;
			}

			if (AsmMnemonic) {
				SStream_concat(O, "%s\t%s, %s, ", AsmMnemonic,
						getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
						getRegisterName(MCOperand_getReg(Op1), AArch64_NoRegAltName));

				printInt32Bang(O, shift);

				MCInst_setOpcodePub(MI, AArch64_map_insn(AsmMnemonic));

				if (MI->csh->detail) {
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
					MI->flat_insn->detail->arm64.op_count++;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op1);
					MI->flat_insn->detail->arm64.op_count++;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = shift;
					MI->flat_insn->detail->arm64.op_count++;
				}

				return;
			}
		}

		// SBFIZ/UBFIZ aliases
		if (MCOperand_getImm(Op2) > MCOperand_getImm(Op3)) {
			SStream_concat(O, "%s\t%s, %s, ", (IsSigned ? "sbfiz" : "ubfiz"),
					getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
					getRegisterName(MCOperand_getReg(Op1), AArch64_NoRegAltName));
			printInt32Bang(O, (int)((Is64Bit ? 64 : 32) - MCOperand_getImm(Op2)));
			SStream_concat0(O, ", ");
			printInt32Bang(O, (int)MCOperand_getImm(Op3) + 1);

			MCInst_setOpcodePub(MI, AArch64_map_insn(IsSigned ? "sbfiz" : "ubfiz"));

			if (MI->csh->detail) {
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
				MI->flat_insn->detail->arm64.op_count++;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op1);
				MI->flat_insn->detail->arm64.op_count++;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = (Is64Bit ? 64 : 32) - (int)MCOperand_getImm(Op2);
				MI->flat_insn->detail->arm64.op_count++;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = (int)MCOperand_getImm(Op3) + 1;
				MI->flat_insn->detail->arm64.op_count++;
			}

			return;
		}

		// Otherwise SBFX/UBFX is the preferred form
		SStream_concat(O, "%s\t%s, %s, ", (IsSigned ? "sbfx" : "ubfx"),
				getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
				getRegisterName(MCOperand_getReg(Op1), AArch64_NoRegAltName));
		printInt32Bang(O, (int)MCOperand_getImm(Op2));
		SStream_concat0(O, ", ");
		printInt32Bang(O, (int)MCOperand_getImm(Op3) - (int)MCOperand_getImm(Op2) + 1);

		MCInst_setOpcodePub(MI, AArch64_map_insn(IsSigned ? "sbfx" : "ubfx"));

		if (MI->csh->detail) {
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
			MI->flat_insn->detail->arm64.op_count++;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op1);
			MI->flat_insn->detail->arm64.op_count++;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = (int)MCOperand_getImm(Op2);
			MI->flat_insn->detail->arm64.op_count++;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = (int)MCOperand_getImm(Op3) - (int)MCOperand_getImm(Op2) + 1;
			MI->flat_insn->detail->arm64.op_count++;
		}

		return;
	}

	if (Opcode == AArch64_BFMXri || Opcode == AArch64_BFMWri) {
		MCOperand *Op0 = MCInst_getOperand(MI, 0); // Op1 == Op0
		MCOperand *Op2 = MCInst_getOperand(MI, 2);
		int ImmR = (int)MCOperand_getImm(MCInst_getOperand(MI, 3));
		int ImmS = (int)MCOperand_getImm(MCInst_getOperand(MI, 4));

		// BFI alias
		if (ImmS < ImmR) {
			int BitWidth = Opcode == AArch64_BFMXri ? 64 : 32;
			LSB = (BitWidth - ImmR) % BitWidth;
			Width = ImmS + 1;

			SStream_concat(O, "bfi\t%s, %s, ",
					getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
					getRegisterName(MCOperand_getReg(Op2), AArch64_NoRegAltName));
			printInt32Bang(O, LSB);
			SStream_concat0(O, ", ");
			printInt32Bang(O, Width);
			MCInst_setOpcodePub(MI, AArch64_map_insn("bfi"));

			if (MI->csh->detail) {
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
				MI->flat_insn->detail->arm64.op_count++;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op2);
				MI->flat_insn->detail->arm64.op_count++;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = LSB;
				MI->flat_insn->detail->arm64.op_count++;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = Width;
				MI->flat_insn->detail->arm64.op_count++;
			}

			return;
		}

		LSB = ImmR;
		Width = ImmS - ImmR + 1;
		// Otherwise BFXIL the preferred form
		SStream_concat(O, "bfxil\t%s, %s, ",
				getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
				getRegisterName(MCOperand_getReg(Op2), AArch64_NoRegAltName));
		printInt32Bang(O, LSB);
		SStream_concat0(O, ", ");
		printInt32Bang(O, Width);
		MCInst_setOpcodePub(MI, AArch64_map_insn("bfxil"));

		if (MI->csh->detail) {
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
			MI->flat_insn->detail->arm64.op_count++;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op2);
			MI->flat_insn->detail->arm64.op_count++;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = LSB;
			MI->flat_insn->detail->arm64.op_count++;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = Width;
			MI->flat_insn->detail->arm64.op_count++;
		}

		return;
	}

	mnem = printAliasInstr(MI, O, Info);
	if (mnem) {
		MCInst_setOpcodePub(MI, AArch64_map_insn(mnem));
		cs_mem_free(mnem);
	} else {
		printInstruction(MI, O, Info);
	}
}